

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O0

void __thiscall capnp::_::PackedInputStream::skip(PackedInputStream *this,size_t bytes)

{
  BufferedInputStream *pBVar1;
  bool bVar2;
  uchar *puVar3;
  byte *pbVar4;
  size_t sVar5;
  ulong uVar6;
  size_t inRemaining;
  Fault f_7;
  undefined1 local_2a0 [8];
  DebugComparison<unsigned_int_&,_unsigned_long_&> _kjCondition_7;
  uint runLength_1;
  Fault f_6;
  unsigned_long local_260;
  DebugExpression<unsigned_long> local_258;
  undefined1 local_250 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_6;
  Fault f_5;
  undefined1 local_218 [8];
  DebugComparison<unsigned_int_&,_unsigned_long_&> _kjCondition_5;
  uint runLength;
  Fault f_4;
  unsigned_long local_1d8;
  DebugExpression<unsigned_long> local_1d0;
  undefined1 local_1c8 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_4;
  Fault f_3;
  size_t local_190;
  DebugExpression<unsigned_long> local_188;
  undefined1 local_180 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_3;
  Fault local_148;
  Fault f_2;
  size_t local_138;
  DebugExpression<unsigned_long> local_130;
  undefined1 local_128 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_2;
  uint local_ec;
  uint i;
  Fault f_1;
  size_t local_d8;
  DebugExpression<unsigned_long> local_d0;
  undefined1 local_c8 [8];
  DebugComparison<unsigned_long,_int> _kjCondition_1;
  byte local_89;
  byte *pbStack_88;
  uint8_t tag;
  uint8_t *in;
  ArrayPtr<const_unsigned_char> buffer;
  Fault local_60;
  Fault f;
  ulong local_50;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  size_t bytes_local;
  PackedInputStream *this_local;
  
  if (bytes != 0) {
    local_50 = bytes & 7;
    _kjCondition._32_8_ = bytes;
    local_48 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_int> *)local_40,&local_48,
               (int *)((long)&f.exception + 4));
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
    if (!bVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[46]>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                 ,0xc0,FAILED,"bytes % sizeof(word) == 0",
                 "_kjCondition,\"PackedInputStream reads must be word-aligned.\"",
                 (DebugComparison<unsigned_long,_int> *)local_40,
                 (char (*) [46])"PackedInputStream reads must be word-aligned.");
      kj::_::Debug::Fault::fatal(&local_60);
    }
    _in = kj::BufferedInputStream::getReadBuffer(this->inner);
    pbStack_88 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
LAB_002abe6a:
    do {
      puVar3 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
      if ((ulong)((long)puVar3 - (long)pbStack_88) < 10) {
        pbVar4 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        if (pbVar4 == pbStack_88) {
          pBVar1 = this->inner;
          sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          (*(pBVar1->super_InputStream)._vptr_InputStream[3])(pBVar1,sVar5);
          join_0x00000010_0x00000000_ = kj::BufferedInputStream::getReadBuffer(this->inner);
          _in = join_0x00000010_0x00000000_;
          local_d8 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          local_d0 = kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_d8);
          f_1.exception._4_4_ = 0;
          kj::_::DebugExpression<unsigned_long>::operator>
                    ((DebugComparison<unsigned_long,_int> *)local_c8,&local_d0,
                     (int *)((long)&f_1.exception + 4));
          bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c8);
          if (!bVar2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                      ((Fault *)&stack0xffffffffffffff18,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0xd0,FAILED,"buffer.size() > 0",
                       "_kjCondition,\"Premature end of packed input.\"",
                       (DebugComparison<unsigned_long,_int> *)local_c8,
                       (char (*) [31])"Premature end of packed input.");
            kj::_::Debug::Fault::~Fault((Fault *)&stack0xffffffffffffff18);
            return;
          }
          pbStack_88 = kj::ArrayPtr<const_unsigned_char>::begin
                                 ((ArrayPtr<const_unsigned_char> *)&in);
          goto LAB_002abe6a;
        }
        local_89 = *pbStack_88;
        pbStack_88 = pbStack_88 + 1;
        for (local_ec = 0; local_ec < 8; local_ec = local_ec + 1) {
          if (((uint)local_89 & 1 << ((byte)local_ec & 0x1f)) != 0) {
            pbVar4 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
            if (pbVar4 == pbStack_88) {
              pBVar1 = this->inner;
              sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
              (*(pBVar1->super_InputStream)._vptr_InputStream[3])(pBVar1,sVar5);
              join_0x00000010_0x00000000_ = kj::BufferedInputStream::getReadBuffer(this->inner);
              _in = join_0x00000010_0x00000000_;
              local_138 = kj::ArrayPtr<const_unsigned_char>::size
                                    ((ArrayPtr<const_unsigned_char> *)&in);
              local_130 = kj::_::DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_138);
              f_2.exception._4_4_ = 0;
              kj::_::DebugExpression<unsigned_long>::operator>
                        ((DebugComparison<unsigned_long,_int> *)local_128,&local_130,
                         (int *)((long)&f_2.exception + 4));
              bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_128);
              if (!bVar2) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                          (&local_148,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                           ,0xdc,FAILED,"buffer.size() > 0",
                           "_kjCondition,\"Premature end of packed input.\"",
                           (DebugComparison<unsigned_long,_int> *)local_128,
                           (char (*) [31])"Premature end of packed input.");
                kj::_::Debug::Fault::~Fault(&local_148);
                return;
              }
              pbStack_88 = kj::ArrayPtr<const_unsigned_char>::begin
                                     ((ArrayPtr<const_unsigned_char> *)&in);
            }
            pbStack_88 = pbStack_88 + 1;
          }
        }
        _kjCondition._32_8_ = _kjCondition._32_8_ + -8;
        pbVar4 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        if ((pbVar4 == pbStack_88) && ((local_89 == 0 || (local_89 == 0xff)))) {
          pBVar1 = this->inner;
          sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          (*(pBVar1->super_InputStream)._vptr_InputStream[3])(pBVar1,sVar5);
          join_0x00000010_0x00000000_ = kj::BufferedInputStream::getReadBuffer(this->inner);
          _in = join_0x00000010_0x00000000_;
          local_190 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          local_188 = kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_190);
          f_3.exception._4_4_ = 0;
          kj::_::DebugExpression<unsigned_long>::operator>
                    ((DebugComparison<unsigned_long,_int> *)local_180,&local_188,
                     (int *)((long)&f_3.exception + 4));
          bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
          if (!bVar2) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
                      ((Fault *)&_kjCondition_4.result,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                       ,0xe4,FAILED,"buffer.size() > 0",
                       "_kjCondition,\"Premature end of packed input.\"",
                       (DebugComparison<unsigned_long,_int> *)local_180,
                       (char (*) [31])"Premature end of packed input.");
            kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_4.result);
            return;
          }
          pbStack_88 = kj::ArrayPtr<const_unsigned_char>::begin
                                 ((ArrayPtr<const_unsigned_char> *)&in);
        }
      }
      else {
        local_89 = *pbStack_88;
        pbStack_88 = pbStack_88 +
                     (long)(int)(uint)((local_89 & 0x80) != 0) +
                     (long)(int)(uint)((local_89 & 0x40) != 0) +
                     (long)(int)(uint)((local_89 & 0x20) != 0) +
                     (long)(int)(uint)((local_89 & 0x10) != 0) +
                     (long)(int)(uint)((local_89 & 8) != 0) +
                     (long)(int)(uint)((local_89 & 4) != 0) +
                     (long)(int)(uint)((local_89 & 2) != 0) +
                     (long)(int)(uint)((local_89 & 1) != 0) + 1;
        _kjCondition._32_8_ = _kjCondition._32_8_ + -8;
      }
      if (local_89 == 0) {
        puVar3 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        local_1d8 = (long)puVar3 - (long)pbStack_88;
        local_1d0 = kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1d8);
        f_4.exception._4_4_ = 0;
        kj::_::DebugExpression<unsigned_long>::operator>
                  ((DebugComparison<unsigned_long,_int> *)local_1c8,&local_1d0,
                   (int *)((long)&f_4.exception + 4));
        bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c8);
        if (!bVar2) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[42]>
                    ((Fault *)&stack0xfffffffffffffe18,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0xfa,FAILED,"BUFFER_REMAINING > 0",
                     "_kjCondition,\"Should always have non-empty buffer here.\"",
                     (DebugComparison<unsigned_long,_int> *)local_1c8,
                     (char (*) [42])"Should always have non-empty buffer here.");
          kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe18);
        }
        _kjCondition_5._36_4_ = (uint)*pbStack_88 << 3;
        f_5.exception =
             (Exception *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (uint *)&_kjCondition_5.field_0x24);
        kj::_::DebugExpression<unsigned_int&>::operator<=
                  ((DebugComparison<unsigned_int_&,_unsigned_long_&> *)local_218,
                   (DebugExpression<unsigned_int&> *)&f_5,(unsigned_long *)&_kjCondition.result);
        bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_218);
        if (!bVar2) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long&>&,char_const(&)[56]>
                    ((Fault *)&_kjCondition_6.result,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0xfe,FAILED,"runLength <= bytes",
                     "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                     (DebugComparison<unsigned_int_&,_unsigned_long_&> *)local_218,
                     (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
          kj::_::Debug::Fault::~Fault((Fault *)&_kjCondition_6.result);
          return;
        }
        _kjCondition._32_8_ = _kjCondition._32_8_ - (ulong)(uint)_kjCondition_5._36_4_;
        pbStack_88 = pbStack_88 + 1;
      }
      else if (local_89 == 0xff) {
        puVar3 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        local_260 = (long)puVar3 - (long)pbStack_88;
        local_258 = kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_260);
        f_6.exception._4_4_ = 0;
        kj::_::DebugExpression<unsigned_long>::operator>
                  ((DebugComparison<unsigned_long,_int> *)local_250,&local_258,
                   (int *)((long)&f_6.exception + 4));
        bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_250);
        if (!bVar2) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[42]>
                    ((Fault *)&stack0xfffffffffffffd90,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x105,FAILED,"BUFFER_REMAINING > 0",
                     "_kjCondition,\"Should always have non-empty buffer here.\"",
                     (DebugComparison<unsigned_long,_int> *)local_250,
                     (char (*) [42])"Should always have non-empty buffer here.");
          kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffd90);
        }
        _kjCondition_7._36_4_ = (uint)*pbStack_88 << 3;
        f_7.exception =
             (Exception *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (uint *)&_kjCondition_7.field_0x24);
        kj::_::DebugExpression<unsigned_int&>::operator<=
                  ((DebugComparison<unsigned_int_&,_unsigned_long_&> *)local_2a0,
                   (DebugExpression<unsigned_int&> *)&f_7,(unsigned_long *)&_kjCondition.result);
        bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a0);
        if (!bVar2) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long&>&,char_const(&)[56]>
                    ((Fault *)&inRemaining,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-packed.c++"
                     ,0x109,FAILED,"runLength <= bytes",
                     "_kjCondition,\"Packed input did not end cleanly on a segment boundary.\"",
                     (DebugComparison<unsigned_int_&,_unsigned_long_&> *)local_2a0,
                     (char (*) [56])"Packed input did not end cleanly on a segment boundary.");
          kj::_::Debug::Fault::~Fault((Fault *)&inRemaining);
          return;
        }
        _kjCondition._32_8_ = _kjCondition._32_8_ - (ulong)(uint)_kjCondition_7._36_4_;
        puVar3 = kj::ArrayPtr<const_unsigned_char>::end((ArrayPtr<const_unsigned_char> *)&in);
        uVar6 = (long)puVar3 - (long)(pbStack_88 + 1);
        if (uVar6 <= (uint)_kjCondition_7._36_4_) {
          _kjCondition_7._36_4_ = _kjCondition_7._36_4_ - (int)uVar6;
          pBVar1 = this->inner;
          sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&in);
          (*(pBVar1->super_InputStream)._vptr_InputStream[3])
                    (pBVar1,sVar5 + (uint)_kjCondition_7._36_4_);
          if (_kjCondition._32_8_ == 0) {
            return;
          }
          _in = kj::BufferedInputStream::getReadBuffer(this->inner);
          pbStack_88 = kj::ArrayPtr<const_unsigned_char>::begin
                                 ((ArrayPtr<const_unsigned_char> *)&in);
          goto LAB_002abe6a;
        }
        pbStack_88 = pbStack_88 + 1 + (uint)_kjCondition_7._36_4_;
      }
    } while (_kjCondition._32_8_ != 0);
    pBVar1 = this->inner;
    puVar3 = kj::ArrayPtr<const_unsigned_char>::begin((ArrayPtr<const_unsigned_char> *)&in);
    (*(pBVar1->super_InputStream)._vptr_InputStream[3])(pBVar1,(long)pbStack_88 - (long)puVar3);
  }
  return;
}

Assistant:

void PackedInputStream::skip(size_t bytes) {
  // We can't just read into buffers because buffers must end on block boundaries.

  if (bytes == 0) {
    return;
  }

  KJ_DREQUIRE(bytes % sizeof(word) == 0, "PackedInputStream reads must be word-aligned.");

  kj::ArrayPtr<const byte> buffer = inner.getReadBuffer();
  const uint8_t* __restrict__ in = reinterpret_cast<const uint8_t*>(buffer.begin());

#define REFRESH_BUFFER() \
  inner.skip(buffer.size()); \
  buffer = inner.getReadBuffer(); \
  KJ_REQUIRE(buffer.size() > 0, "Premature end of packed input.") { return; } \
  in = reinterpret_cast<const uint8_t*>(buffer.begin())

  for (;;) {
    uint8_t tag;

    if (BUFFER_REMAINING < 10) {
      if (BUFFER_REMAINING == 0) {
        REFRESH_BUFFER();
        continue;
      }

      // We have at least 1, but not 10, bytes available.  We need to read slowly, doing a bounds
      // check on each byte.

      tag = *in++;

      for (uint i = 0; i < 8; i++) {
        if (tag & (1u << i)) {
          if (BUFFER_REMAINING == 0) {
            REFRESH_BUFFER();
          }
          in++;
        }
      }
      bytes -= 8;

      if (BUFFER_REMAINING == 0 && (tag == 0 || tag == 0xffu)) {
        REFRESH_BUFFER();
      }
    } else {
      tag = *in++;

#define HANDLE_BYTE(n) \
      in += (tag & (1u << n)) != 0

      HANDLE_BYTE(0);
      HANDLE_BYTE(1);
      HANDLE_BYTE(2);
      HANDLE_BYTE(3);
      HANDLE_BYTE(4);
      HANDLE_BYTE(5);
      HANDLE_BYTE(6);
      HANDLE_BYTE(7);
#undef HANDLE_BYTE

      bytes -= 8;
    }

    if (tag == 0) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

    } else if (tag == 0xffu) {
      KJ_DASSERT(BUFFER_REMAINING > 0, "Should always have non-empty buffer here.");

      uint runLength = *in++ * sizeof(word);

      KJ_REQUIRE(runLength <= bytes, "Packed input did not end cleanly on a segment boundary.") {
        return;
      }

      bytes -= runLength;

      size_t inRemaining = BUFFER_REMAINING;
      if (inRemaining > runLength) {
        // Fast path.
        in += runLength;
      } else {
        // Forward skip to the underlying stream.
        runLength -= inRemaining;
        inner.skip(buffer.size() + runLength);

        if (bytes == 0) {
          return;
        } else {
          buffer = inner.getReadBuffer();
          in = reinterpret_cast<const uint8_t*>(buffer.begin());

          // Skip the bounds check below since we just did the same check above.
          continue;
        }
      }
    }

    if (bytes == 0) {
      inner.skip(in - reinterpret_cast<const uint8_t*>(buffer.begin()));
      return;
    }
  }

  KJ_FAIL_ASSERT("Can't get here.");
}